

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

void __thiscall
QVLABase<QRingBuffer>::resize_impl
          (QVLABase<QRingBuffer> *this,qsizetype prealloc,void *array,qsizetype sz)

{
  size_type sVar1;
  long in_RCX;
  QRingBuffer *in_RDI;
  long in_FS_OFFSET;
  qsizetype unaff_retaddr;
  QVLABase<QRingBuffer> *in_stack_00000008;
  qsizetype in_stack_00000020;
  size_type local_18;
  long local_10;
  void *array_00;
  
  array_00 = *(void **)(in_FS_OFFSET + 0x28);
  local_10 = in_RCX;
  local_18 = QVLABaseBase::capacity((QVLABaseBase *)in_RDI);
  qMax<long_long>(&local_10,&local_18);
  reallocate_impl(in_stack_00000008,unaff_retaddr,array_00,(qsizetype)array,in_stack_00000020);
  while( true ) {
    sVar1 = QVLABaseBase::size((QVLABaseBase *)in_RDI);
    if (local_10 <= sVar1) break;
    data((QVLABase<QRingBuffer> *)in_RDI);
    QVLABaseBase::size((QVLABaseBase *)in_RDI);
    q20::construct_at<QRingBuffer,,void>(in_RDI);
    (in_RDI->buffers).d.ptr = (QRingChunk *)((long)&(((in_RDI->buffers).d.ptr)->chunk).d.d + 1);
  }
  if (*(void **)(in_FS_OFFSET + 0x28) == array_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void resize_impl(qsizetype prealloc, void *array, qsizetype sz)
    {
        reallocate_impl(prealloc, array, sz, qMax(sz, capacity()));
        if constexpr (QTypeInfo<T>::isComplex) {
            // call default constructor for new objects (which can throw)
            while (size() < sz) {
                q20::construct_at(data() + size());
                ++s;
            }
        } else {
            s = sz;
        }
    }